

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Fts5HashEntry * fts5HashEntryMerge(Fts5HashEntry *pLeft,Fts5HashEntry *pRight)

{
  int iVar1;
  int iVar2;
  Fts5HashEntry *pFVar3;
  int iVar4;
  Fts5HashEntry *pFVar5;
  Fts5HashEntry **ppFVar6;
  Fts5HashEntry *pRet;
  Fts5HashEntry *local_28;
  
  ppFVar6 = &local_28;
  local_28 = (Fts5HashEntry *)0x0;
  if (pLeft == (Fts5HashEntry *)0x0 && pRight == (Fts5HashEntry *)0x0) {
    local_28 = (Fts5HashEntry *)0x0;
  }
  else {
    do {
      if (pLeft == (Fts5HashEntry *)0x0) {
        *ppFVar6 = pRight;
LAB_001e73d0:
        pFVar3 = (Fts5HashEntry *)0x0;
        pFVar5 = (Fts5HashEntry *)0x0;
      }
      else {
        if (pRight == (Fts5HashEntry *)0x0) {
          *ppFVar6 = pLeft;
          goto LAB_001e73d0;
        }
        iVar4 = pLeft->nKey;
        iVar1 = pRight->nKey;
        iVar2 = iVar4;
        if (iVar1 <= iVar4) {
          iVar2 = iVar1;
        }
        iVar2 = memcmp(pLeft + 1,pRight + 1,(long)iVar2);
        iVar4 = iVar4 - iVar1;
        if (iVar2 != 0) {
          iVar4 = iVar2;
        }
        if (iVar4 < 1) {
          *ppFVar6 = pLeft;
          pFVar5 = pLeft->pScanNext;
          pFVar3 = pRight;
          pRight = pLeft;
        }
        else {
          *ppFVar6 = pRight;
          pFVar3 = pRight->pScanNext;
          pFVar5 = pLeft;
        }
        ppFVar6 = &pRight->pScanNext;
        *ppFVar6 = (Fts5HashEntry *)0x0;
      }
      pRight = pFVar3;
      pLeft = pFVar5;
    } while (pFVar5 != (Fts5HashEntry *)0x0 || pFVar3 != (Fts5HashEntry *)0x0);
  }
  return local_28;
}

Assistant:

static Fts5HashEntry *fts5HashEntryMerge(
  Fts5HashEntry *pLeft,
  Fts5HashEntry *pRight
){
  Fts5HashEntry *p1 = pLeft;
  Fts5HashEntry *p2 = pRight;
  Fts5HashEntry *pRet = 0;
  Fts5HashEntry **ppOut = &pRet;

  while( p1 || p2 ){
    if( p1==0 ){
      *ppOut = p2;
      p2 = 0;
    }else if( p2==0 ){
      *ppOut = p1;
      p1 = 0;
    }else{
      char *zKey1 = fts5EntryKey(p1);
      char *zKey2 = fts5EntryKey(p2);
      int nMin = MIN(p1->nKey, p2->nKey);

      int cmp = memcmp(zKey1, zKey2, nMin);
      if( cmp==0 ){
        cmp = p1->nKey - p2->nKey;
      }
      assert( cmp!=0 );

      if( cmp>0 ){
        /* p2 is smaller */
        *ppOut = p2;
        ppOut = &p2->pScanNext;
        p2 = p2->pScanNext;
      }else{
        /* p1 is smaller */
        *ppOut = p1;
        ppOut = &p1->pScanNext;
        p1 = p1->pScanNext;
      }
      *ppOut = 0;
    }
  }

  return pRet;
}